

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaQbf.c
# Opt level: O2

Vec_Int_t *
Gia_GenCreateMuxes(Gia_Man_t *p,Gia_Man_t *pNew,Vec_Int_t *vFlops,int nLutNum,int nLutSize,
                  Vec_Int_t *vParLits,int fUseRi)

{
  uint __line;
  int iVar1;
  int iVar2;
  Vec_Int_t *p_00;
  Gia_Obj_t *pGVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  char *__assertion;
  ulong uVar7;
  ulong uVar8;
  int pCtrl [16];
  
  p_00 = Vec_IntAlloc(nLutNum);
  if (vFlops->nSize != nLutSize * nLutNum) {
    __assertion = "Vec_IntSize(vFlops) == nLutNum * nLutSize";
    __line = 0x77;
LAB_0060f9dc:
    __assert_fail(__assertion,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaQbf.c"
                  ,__line,
                  "Vec_Int_t *Gia_GenCreateMuxes(Gia_Man_t *, Gia_Man_t *, Vec_Int_t *, int, int, Vec_Int_t *, int)"
                 );
  }
  uVar5 = 0;
  uVar8 = 0;
  if (0 < nLutSize) {
    uVar8 = (ulong)(uint)nLutSize;
  }
  uVar7 = (ulong)(uint)nLutNum;
  if (nLutNum < 1) {
    uVar7 = uVar5;
  }
  uVar4 = 0;
  do {
    if (uVar4 == uVar7) {
      return p_00;
    }
    for (uVar6 = 0; uVar8 != uVar6; uVar6 = uVar6 + 1) {
      iVar1 = Vec_IntEntry(vFlops,(int)uVar5 + (int)uVar6);
      if ((iVar1 < 0) || (iVar2 = iVar1 - p->nRegs, p->nRegs <= iVar1)) {
        __assertion = "iFlop >= 0 && iFlop < Gia_ManRegNum(p)";
        __line = 0x7d;
        goto LAB_0060f9dc;
      }
      if (fUseRi == 0) {
        pGVar3 = Gia_ManCi(p,iVar2 + p->vCis->nSize);
      }
      else {
        pGVar3 = Gia_ManCo(p,iVar2 + p->vCos->nSize);
      }
      pCtrl[uVar6] = pGVar3->Value;
    }
    iVar1 = Gia_GenCreateMux_rec(pNew,pCtrl,nLutSize,vParLits,(int)uVar4 << ((byte)nLutSize & 0x1f))
    ;
    Vec_IntPush(p_00,iVar1);
    uVar4 = uVar4 + 1;
    uVar5 = uVar5 + (uint)nLutSize;
  } while( true );
}

Assistant:

Vec_Int_t * Gia_GenCreateMuxes( Gia_Man_t * p, Gia_Man_t * pNew, Vec_Int_t * vFlops, int nLutNum, int nLutSize, Vec_Int_t * vParLits, int fUseRi )
{
    Vec_Int_t * vLits = Vec_IntAlloc( nLutNum );
    int i, k, iMux, iFlop, pCtrl[16];
    // add MUXes for each group of flops
    assert( Vec_IntSize(vFlops) == nLutNum * nLutSize );
    for ( i = 0; i < nLutNum; i++ )
    {
        for ( k = 0; k < nLutSize; k++ )
        {
            iFlop = Vec_IntEntry(vFlops, i * nLutSize + k);
            assert( iFlop >= 0 && iFlop < Gia_ManRegNum(p) );
            if ( fUseRi )
                pCtrl[k] = Gia_ManRi(p, iFlop)->Value;
            else
                pCtrl[k] = Gia_ManRo(p, iFlop)->Value;
        }
        iMux = Gia_GenCreateMux_rec( pNew, pCtrl, nLutSize, vParLits, i * (1 << nLutSize) );
        Vec_IntPush( vLits, iMux );
    }
    return vLits;
}